

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O2

mz_bool mz_zip_reader_is_file_encrypted(mz_zip_archive *pZip,mz_uint file_index)

{
  mz_zip_internal_state *pmVar1;
  void *pvVar2;
  ulong uVar3;
  
  if (pZip != (mz_zip_archive *)0x0) {
    pmVar1 = pZip->m_pState;
    if ((pmVar1 != (mz_zip_internal_state *)0x0) && (file_index < pZip->m_total_files)) {
      if (((pmVar1->m_central_dir_offsets).m_size <= (ulong)file_index) ||
         (uVar3 = (ulong)*(uint *)((long)(pmVar1->m_central_dir_offsets).m_p + (ulong)file_index * 4
                                  ), (pmVar1->m_central_dir).m_size <= uVar3)) {
        __assert_fail("index < pArray->m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/test/../Zippy/library/Zippy/miniz/miniz.h"
                      ,0x129b,"mz_uint mz_zip_array_range_check(const mz_zip_array *, mz_uint)");
      }
      pvVar2 = (pmVar1->m_central_dir).m_p;
      if (pvVar2 != (void *)0x0) {
        return (uint)((*(byte *)((long)pvVar2 + uVar3 + 8) & 0x41) != 0);
      }
    }
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
  }
  return 0;
}

Assistant:

inline mz_bool mz_zip_reader_is_file_encrypted(mz_zip_archive* pZip, mz_uint file_index) {

    mz_uint m_bit_flag;
    const mz_uint8* p = mz_zip_get_cdh(pZip, file_index);
    if (!p) {
        mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);
        return MZ_FALSE;
    }

    m_bit_flag = MZ_READ_LE16(p + MZ_ZIP_CDH_BIT_FLAG_OFS);
    return (m_bit_flag
            & (MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_IS_ENCRYPTED | MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_USES_STRONG_ENCRYPTION))
            != 0;
}